

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::analysis::LivenessManager::AnalyzeBuiltIn(LivenessManager *this,uint32_t id)

{
  uint32_t id_00;
  IRContext *this_00;
  DecorationManager *this_01;
  anon_class_16_2_270a2bfa local_58;
  function<void_(const_spvtools::opt::Instruction_&)> local_48;
  bool local_21;
  DecorationManager *pDStack_20;
  bool saw_builtin;
  DecorationManager *deco_mgr;
  LivenessManager *pLStack_10;
  uint32_t id_local;
  LivenessManager *this_local;
  
  deco_mgr._4_4_ = id;
  pLStack_10 = this;
  this_00 = context(this);
  this_01 = IRContext::get_decoration_mgr(this_00);
  id_00 = deco_mgr._4_4_;
  local_21 = false;
  local_58.saw_builtin = &local_21;
  local_58.this = this;
  pDStack_20 = this_01;
  std::function<void(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::analysis::LivenessManager::AnalyzeBuiltIn(unsigned_int)::__0,void>
            ((function<void(spvtools::opt::Instruction_const&)> *)&local_48,&local_58);
  DecorationManager::ForEachDecoration(this_01,id_00,0xb,&local_48);
  std::function<void_(const_spvtools::opt::Instruction_&)>::~function(&local_48);
  return (bool)(local_21 & 1);
}

Assistant:

bool LivenessManager::AnalyzeBuiltIn(uint32_t id) {
  auto deco_mgr = context()->get_decoration_mgr();
  bool saw_builtin = false;
  // Analyze all builtin decorations of |id|.
  (void)deco_mgr->ForEachDecoration(
      id, uint32_t(spv::Decoration::BuiltIn),
      [this, &saw_builtin](const Instruction& deco_inst) {
        saw_builtin = true;
        // No need to process builtins in frag shader. All assumed used.
        if (context()->GetStage() == spv::ExecutionModel::Fragment) return;
        uint32_t builtin = uint32_t(spv::BuiltIn::Max);
        if (deco_inst.opcode() == spv::Op::OpDecorate)
          builtin =
              deco_inst.GetSingleWordInOperand(kOpDecorateBuiltInLiteralInIdx);
        else if (deco_inst.opcode() == spv::Op::OpMemberDecorate)
          builtin = deco_inst.GetSingleWordInOperand(
              kOpDecorateMemberBuiltInLiteralInIdx);
        else
          assert(false && "unexpected decoration");
        if (IsAnalyzedBuiltin(builtin)) live_builtins_.insert(builtin);
      });
  return saw_builtin;
}